

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

cmServerResponse * __thiscall
cmServerProtocol1::ProcessConfigure
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *cm;
  cmState *pcVar1;
  bool bVar2;
  int iVar3;
  cmFileMonitor *pcVar4;
  Value *pVVar5;
  char *pcVar6;
  size_t sVar7;
  ValueHolder VVar8;
  _Alloc_hider gg;
  const_iterator cVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Value passedArgs;
  string sourceDir;
  string errorMessage;
  string buildDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toWatchList;
  undefined1 local_1a8 [16];
  undefined1 local_198 [24];
  ValueHolder local_180 [2];
  size_type local_170 [3];
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  ValueHolder local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  undefined1 local_d8 [24];
  cmServerResponse local_c0;
  
  if (this->m_State == STATE_INACTIVE) {
    local_180[0].string_ = (char *)local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,"This instance is inactive.","");
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_180);
    VVar8 = local_180[0];
    if (local_180[0] == local_170) {
      return __return_storage_ptr__;
    }
    goto LAB_0052c4b3;
  }
  pcVar4 = cmServer::FileMonitor((this->super_cmServerProtocol).m_Server);
  cmFileMonitor::StopMonitoring(pcVar4);
  local_138.string_ = (char *)&local_128;
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  cm = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
       super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
       super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
       super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  GeneratorInformation::SetupGenerator(&this->GeneratorInfo,cm,(string *)&local_138);
  if (local_130 == 0) {
    local_180[0].string_ = (char *)local_170;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"unused","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_180;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_f0,__l,(allocator_type *)local_1a8);
    if (local_180[0] != local_170) {
      operator_delete(local_180[0].string_,local_170[0] + 1);
    }
    pVVar5 = Json::Value::operator[](&request->Data,&kCACHE_ARGUMENTS_KEY_abi_cxx11_);
    Json::Value::Value((Value *)local_180,pVVar5);
    bVar2 = Json::Value::isNull((Value *)local_180);
    if (!bVar2) {
      bVar2 = Json::Value::isString((Value *)local_180);
      if (bVar2) {
        Json::Value::asString_abi_cxx11_((string *)local_1a8,(Value *)local_180);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        if ((cmServerProtocol1 *)local_1a8._0_8_ != (cmServerProtocol1 *)local_198) {
LAB_0052bfc4:
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
        }
      }
      else {
        bVar2 = Json::Value::isArray((Value *)local_180);
        if (bVar2) {
          cVar9 = Json::Value::begin((Value *)local_180);
          local_158._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
          local_158[8] = cVar9.super_ValueIteratorBase.isNull_;
          while( true ) {
            cVar9 = Json::Value::end((Value *)local_180);
            local_1a8._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
            local_1a8[8] = cVar9.super_ValueIteratorBase.isNull_;
            bVar2 = Json::ValueIteratorBase::isEqual
                              ((ValueIteratorBase *)local_158,(SelfType *)local_1a8);
            if (bVar2) break;
            pVVar5 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_158);
            bVar2 = Json::Value::isString(pVVar5);
            if (!bVar2) goto LAB_0052bf16;
            pVVar5 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_158);
            Json::Value::asString_abi_cxx11_((string *)local_1a8,pVVar5);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8);
            if ((cmServerProtocol1 *)local_1a8._0_8_ != (cmServerProtocol1 *)local_198) {
              operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
            }
            Json::ValueIteratorBase::increment((ValueIteratorBase *)local_158);
          }
        }
        else {
LAB_0052bf16:
          local_1a8._0_8_ = (cmServerProtocol1 *)local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "cacheArguments must be unset, a string or an array of strings.","");
          cmServerRequest::ReportError(&local_c0,request,(string *)local_1a8);
          Json::Value::~Value(&local_c0.m_Data);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.m_ErrorMessage._M_dataplus._M_p != &local_c0.m_ErrorMessage.field_2) {
            operator_delete(local_c0.m_ErrorMessage._M_dataplus._M_p,
                            local_c0.m_ErrorMessage.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.Cookie._M_dataplus._M_p != &local_c0.Cookie.field_2) {
            operator_delete(local_c0.Cookie._M_dataplus._M_p,
                            local_c0.Cookie.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.Type._M_dataplus._M_p != &local_c0.Type.field_2) {
            operator_delete(local_c0.Type._M_dataplus._M_p,
                            local_c0.Type.field_2._M_allocated_capacity + 1);
          }
          if ((cmServerProtocol1 *)local_1a8._0_8_ != (cmServerProtocol1 *)local_198)
          goto LAB_0052bfc4;
        }
      }
    }
    pcVar6 = cmake::GetHomeDirectory(cm);
    std::__cxx11::string::string((string *)local_158,pcVar6,(allocator *)local_1a8);
    pcVar6 = cmake::GetHomeOutputDirectory(cm);
    std::__cxx11::string::string((string *)local_110,pcVar6,(allocator *)local_1a8);
    if (local_110._8_8_ == 0) {
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"No build directory set via Handshake.","");
      cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a8);
LAB_0052c430:
      if ((cmServerProtocol1 *)local_1a8._0_8_ != (cmServerProtocol1 *)local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
      }
    }
    else {
      gg._M_p = (pointer)cm->GlobalGenerator;
      bVar2 = cmake::LoadCache(cm,(string *)local_110);
      if (!bVar2) {
        if (CONCAT71(local_158._9_7_,local_158[8]) != 0) goto LAB_0052c20b;
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "No sourceDirectory set via setGlobalSettings and no cache found in buildDirectory."
                   ,"");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a8);
        goto LAB_0052c430;
      }
      pcVar1 = cm->State;
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_HOME_DIRECTORY","")
      ;
      pcVar6 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_1a8);
      if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
      }
      if (pcVar6 == (char *)0x0) {
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"No CMAKE_HOME_DIRECTORY found in cache.","");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a8);
        goto LAB_0052c430;
      }
      if (CONCAT71(local_158._9_7_,local_158[8]) == 0) {
        local_1a8._0_8_ = local_198;
        sVar7 = strlen(pcVar6);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar6,pcVar6 + sVar7);
        std::__cxx11::string::operator=((string *)local_158,(string *)local_1a8);
        if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
        }
        cmake::SetHomeDirectory(cm,(string *)local_158);
      }
      pcVar1 = cm->State;
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_GENERATOR","");
      pcVar6 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_1a8);
      if ((cmServerProtocol1 *)local_1a8._0_8_ != (cmServerProtocol1 *)local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
      }
      if ((cmGlobalGenerator *)gg._M_p != (cmGlobalGenerator *)0x0 && pcVar6 != (char *)0x0) {
        local_118._M_p = gg._M_p;
        (*((cmGlobalGenerator *)gg._M_p)->_vptr_cmGlobalGenerator[3])(local_1a8,gg._M_p);
        iVar3 = std::__cxx11::string::compare(local_1a8);
        if ((cmServerProtocol1 *)local_1a8._0_8_ != (cmServerProtocol1 *)local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
        }
        gg._M_p = local_118._M_p;
        if (iVar3 != 0) {
          local_1a8._0_8_ = local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "Configured generator does not match with CMAKE_GENERATOR found in cache.","");
          cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a8);
          goto LAB_0052c430;
        }
      }
LAB_0052c20b:
      cmSystemTools::s_FatalErrorOccured = false;
      cmSystemTools::s_ErrorOccured = false;
      iVar3 = cmake::AddCMakePaths(cm);
      if (iVar3 != 1) {
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Failed to set CMake paths.","");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a8);
        goto LAB_0052c430;
      }
      bVar2 = cmake::SetCacheArgs(cm,&local_f0);
      if (!bVar2) {
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"cacheArguments could not be set.","");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a8);
        goto LAB_0052c430;
      }
      iVar3 = cmake::Configure(cm);
      if (iVar3 < 0) {
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Configuration failed.","");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1a8);
        goto LAB_0052c430;
      }
      local_d8._0_8_ = (pointer)0x0;
      local_d8._8_8_ = (pointer)0x0;
      local_d8._16_8_ = 0;
      local_1a8._8_8_ = 0;
      local_198._0_8_ = local_198._0_8_ & 0xffffffffffffff00;
      local_1a8._0_8_ = (_Base_ptr)local_198;
      anon_unknown.dwarf_15b4ff4::getCMakeInputs
                ((cmGlobalGenerator *)gg._M_p,(string *)local_1a8,(string *)local_110,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
      }
      pcVar4 = cmServer::FileMonitor((this->super_cmServerProtocol).m_Server);
      local_1a8._8_8_ = 0;
      local_198._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1101:31)>
           ::_M_invoke;
      local_198._0_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1101:31)>
           ::_M_manager;
      local_1a8._0_8_ = this;
      cmFileMonitor::MonitorPaths
                (pcVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_d8,(Callback *)local_1a8);
      if ((code *)local_198._0_8_ != (code *)0x0) {
        (*(code *)local_198._0_8_)(local_1a8,local_1a8,3);
      }
      this->m_State = STATE_CONFIGURED;
      this->m_isDirty = false;
      Json::Value::Value((Value *)local_1a8,nullValue);
      cmServerRequest::Reply(__return_storage_ptr__,request,(Value *)local_1a8);
      Json::Value::~Value((Value *)local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._0_8_ != &local_100) {
      operator_delete((void *)local_110._0_8_,local_100._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._0_8_ != &local_148) {
      operator_delete((void *)local_158._0_8_,local_148._M_allocated_capacity + 1);
    }
    Json::Value::~Value((Value *)local_180);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f0);
  }
  else {
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_138);
  }
  if (local_138 == &local_128) {
    return __return_storage_ptr__;
  }
  local_170[0] = CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]);
  VVar8 = local_138;
LAB_0052c4b3:
  operator_delete(VVar8.string_,local_170[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessConfigure(
  const cmServerRequest& request)
{
  if (this->m_State == STATE_INACTIVE) {
    return request.ReportError("This instance is inactive.");
  }

  FileMonitor()->StopMonitoring();

  std::string errorMessage;
  cmake* cm = this->CMakeInstance();
  this->GeneratorInfo.SetupGenerator(cm, &errorMessage);
  if (!errorMessage.empty()) {
    return request.ReportError(errorMessage);
  }

  // Make sure the types of cacheArguments matches (if given):
  std::vector<std::string> cacheArgs = { "unused" };
  bool cacheArgumentsError = false;
  const Json::Value passedArgs = request.Data[kCACHE_ARGUMENTS_KEY];
  if (!passedArgs.isNull()) {
    if (passedArgs.isString()) {
      cacheArgs.push_back(passedArgs.asString());
    } else if (passedArgs.isArray()) {
      for (auto i = passedArgs.begin(); i != passedArgs.end(); ++i) {
        if (!i->isString()) {
          cacheArgumentsError = true;
          break;
        }
        cacheArgs.push_back(i->asString());
      }
    } else {
      cacheArgumentsError = true;
    }
  }
  if (cacheArgumentsError) {
    request.ReportError(
      "cacheArguments must be unset, a string or an array of strings.");
  }

  std::string sourceDir = cm->GetHomeDirectory();
  const std::string buildDir = cm->GetHomeOutputDirectory();

  cmGlobalGenerator* gg = cm->GetGlobalGenerator();

  if (buildDir.empty()) {
    return request.ReportError("No build directory set via Handshake.");
  }

  if (cm->LoadCache(buildDir)) {
    // build directory has been set up before
    const char* cachedSourceDir =
      cm->GetState()->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    if (!cachedSourceDir) {
      return request.ReportError("No CMAKE_HOME_DIRECTORY found in cache.");
    }
    if (sourceDir.empty()) {
      sourceDir = std::string(cachedSourceDir);
      cm->SetHomeDirectory(sourceDir);
    }

    const char* cachedGenerator =
      cm->GetState()->GetInitializedCacheValue("CMAKE_GENERATOR");
    if (cachedGenerator) {
      if (gg && gg->GetName() != cachedGenerator) {
        return request.ReportError("Configured generator does not match with "
                                   "CMAKE_GENERATOR found in cache.");
      }
    }
  } else {
    // build directory has not been set up before
    if (sourceDir.empty()) {
      return request.ReportError("No sourceDirectory set via "
                                 "setGlobalSettings and no cache found in "
                                 "buildDirectory.");
    }
  }

  cmSystemTools::ResetErrorOccuredFlag(); // Reset error state

  if (cm->AddCMakePaths() != 1) {
    return request.ReportError("Failed to set CMake paths.");
  }

  if (!cm->SetCacheArgs(cacheArgs)) {
    return request.ReportError("cacheArguments could not be set.");
  }

  int ret = cm->Configure();
  if (ret < 0) {
    return request.ReportError("Configuration failed.");
  }

  std::vector<std::string> toWatchList;
  getCMakeInputs(gg, std::string(), buildDir, nullptr, &toWatchList, nullptr);

  FileMonitor()->MonitorPaths(toWatchList,
                              [this](const std::string& p, int e, int s) {
                                this->HandleCMakeFileChanges(p, e, s);
                              });

  m_State = STATE_CONFIGURED;
  m_isDirty = false;
  return request.Reply(Json::Value());
}